

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.h
# Opt level: O2

bool absl::lts_20250127::cord_internal::operator==(InlineData *lhs,InlineData *rhs)

{
  undefined1 auVar1 [16];
  
  auVar1[0] = -((lhs->rep_).field_0.data[0] == (rhs->rep_).field_0.data[0]);
  auVar1[1] = -((lhs->rep_).field_0.data[1] == (rhs->rep_).field_0.data[1]);
  auVar1[2] = -((lhs->rep_).field_0.data[2] == (rhs->rep_).field_0.data[2]);
  auVar1[3] = -((lhs->rep_).field_0.data[3] == (rhs->rep_).field_0.data[3]);
  auVar1[4] = -((lhs->rep_).field_0.data[4] == (rhs->rep_).field_0.data[4]);
  auVar1[5] = -((lhs->rep_).field_0.data[5] == (rhs->rep_).field_0.data[5]);
  auVar1[6] = -((lhs->rep_).field_0.data[6] == (rhs->rep_).field_0.data[6]);
  auVar1[7] = -((lhs->rep_).field_0.data[7] == (rhs->rep_).field_0.data[7]);
  auVar1[8] = -((lhs->rep_).field_0.data[8] == (rhs->rep_).field_0.data[8]);
  auVar1[9] = -((lhs->rep_).field_0.data[9] == (rhs->rep_).field_0.data[9]);
  auVar1[10] = -((lhs->rep_).field_0.data[10] == (rhs->rep_).field_0.data[10]);
  auVar1[0xb] = -((lhs->rep_).field_0.data[0xb] == (rhs->rep_).field_0.data[0xb]);
  auVar1[0xc] = -((lhs->rep_).field_0.data[0xc] == (rhs->rep_).field_0.data[0xc]);
  auVar1[0xd] = -((lhs->rep_).field_0.data[0xd] == (rhs->rep_).field_0.data[0xd]);
  auVar1[0xe] = -((lhs->rep_).field_0.data[0xe] == (rhs->rep_).field_0.data[0xe]);
  auVar1[0xf] = -((lhs->rep_).field_0.data[0xf] == (rhs->rep_).field_0.data[0xf]);
  return (ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe | (ushort)(auVar1[0xf] >> 7) << 0xf)
         == 0xffff;
}

Assistant:

bool operator==(const InlineData& lhs, const InlineData& rhs) {
#ifdef ABSL_INTERNAL_CORD_HAVE_SANITIZER
    const Rep l = lhs.rep_.SanitizerSafeCopy();
    const Rep r = rhs.rep_.SanitizerSafeCopy();
    return memcmp(&l, &r, sizeof(l)) == 0;
#else
    return memcmp(&lhs, &rhs, sizeof(lhs)) == 0;
#endif
  }